

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET hal_h265e_vepu511_ret_task(void *hal,HalEncTask *task)

{
  long lVar1;
  EncRcTask *pEVar2;
  size_t sVar3;
  RK_U32 offset;
  EncRcTaskInfo *rc_info;
  Vepu511H265Fbk *fb;
  Vepu511H265eFrmCfg *frm;
  RK_S32 task_idx;
  HalEncTask *enc_task;
  H265eV511HalContext *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  pEVar2 = task->rc_task;
  sVar3 = mpp_packet_get_length(task->packet);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0xa84);
  }
  vepu511_h265_set_feedback((H265eV511HalContext *)hal,task);
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar3,*(RK_U32 *)(lVar1 + 0x34),"hal_h265e_vepu511_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)(lVar1 + 0x34));
  (pEVar2->info).sse = *(RK_S64 *)(lVar1 + 0x40);
  (pEVar2->info).lvl64_inter_num = *(RK_U32 *)(lVar1 + 0x48);
  (pEVar2->info).lvl32_inter_num = *(RK_U32 *)(lVar1 + 0x4c);
  (pEVar2->info).lvl16_inter_num = *(RK_U32 *)(lVar1 + 0x50);
  (pEVar2->info).lvl8_inter_num = *(RK_U32 *)(lVar1 + 0x54);
  (pEVar2->info).lvl32_intra_num = *(RK_U32 *)(lVar1 + 0x58);
  (pEVar2->info).lvl16_intra_num = *(RK_U32 *)(lVar1 + 0x5c);
  (pEVar2->info).lvl8_intra_num = *(RK_U32 *)(lVar1 + 0x60);
  (pEVar2->info).lvl4_intra_num = *(RK_U32 *)(lVar1 + 100);
  task->hw_length = *(RK_S32 *)(lVar1 + 0x34);
  task->length = *(int *)(lVar1 + 0x34) + task->length;
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3c8),*(RK_S32 *)(lVar1 + 0x10));
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3c8),*(RK_S32 *)(lVar1 + 0x14));
  if ((hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","output stream size %d\n",(char *)0x0,
               (ulong)*(uint *)(lVar1 + 0x34));
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0xa9d);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_vepu511_ret_task(void *hal, HalEncTask *task)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu511H265eFrmCfg *frm = ctx->frms[task_idx];
    Vepu511H265Fbk *fb = &frm->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu511_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    h265e_dpb_hal_end(ctx->dpb, frm->hal_curr_idx);
    h265e_dpb_hal_end(ctx->dpb, frm->hal_refr_idx);

    // vepu511_h265e_tune_stat_update(ctx->tune, enc_task);

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);
    hal_h265e_leave();
    return MPP_OK;
}